

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_index_load(BGZF *fp,char *bname,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  char *__filename;
  FILE *__stream;
  bgzidx_t *pbVar3;
  bgzidx1_t *pbVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint64_t x;
  ulong local_40;
  FILE *local_38;
  
  if (suffix == (char *)0x0) {
    __stream = fopen(bname,"rb");
  }
  else {
    sVar1 = strlen(bname);
    sVar2 = strlen(suffix);
    iVar8 = (int)sVar1;
    __filename = (char *)malloc((long)((int)sVar2 + iVar8 + 1));
    if (__filename == (char *)0x0) {
      return -1;
    }
    memcpy(__filename,bname,(long)iVar8);
    memcpy(__filename + iVar8,suffix,(long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    __stream = fopen(__filename,"rb");
    free(__filename);
  }
  if (__stream == (FILE *)0x0) {
    return -1;
  }
  pbVar3 = (bgzidx_t *)calloc(1,0x18);
  fp->idx = pbVar3;
  sVar1 = fread(&local_40,1,8,__stream);
  if (sVar1 != 8) {
    return -1;
  }
  uVar10 = local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
           (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8;
  if (((undefined1  [96])*fp & (undefined1  [96])0xc0000) == (undefined1  [96])0x0) {
    uVar10 = local_40;
  }
  iVar8 = (int)uVar10;
  iVar5 = iVar8 + 1;
  pbVar3 = fp->idx;
  pbVar3->moffs = iVar5;
  pbVar3->noffs = iVar5;
  pbVar4 = (bgzidx1_t *)malloc((long)iVar5 << 4);
  pbVar3->offs = pbVar4;
  pbVar4->uaddr = 0;
  pbVar4->caddr = 0;
  if ((fp->field_0x2 & 0xc) == 0) {
    uVar10 = 0;
    if (iVar5 < 2) goto LAB_0013dd3b;
    lVar6 = 1;
    lVar7 = 0;
    do {
      sVar1 = fread(&local_40,1,8,__stream);
      *(ulong *)((long)&fp->idx->offs[1].caddr + lVar7) = local_40;
      sVar2 = fread(&local_40,1,8,__stream);
      uVar9 = (int)sVar2 + (int)sVar1 + (int)uVar10;
      uVar10 = (ulong)uVar9;
      pbVar3 = fp->idx;
      *(ulong *)((long)&pbVar3->offs[1].uaddr + lVar7) = local_40;
      lVar6 = lVar6 + 1;
      iVar8 = pbVar3->noffs;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar8);
  }
  else {
    uVar10 = 0;
    if (iVar5 < 2) goto LAB_0013dd3b;
    lVar6 = 1;
    lVar7 = 0;
    local_38 = __stream;
    do {
      sVar1 = fread(&local_40,1,8,local_38);
      __stream = local_38;
      *(ulong *)((long)&fp->idx->offs[1].caddr + lVar7) =
           local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
           (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
           (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
           (local_40 & 0xff00) << 0x28 | local_40 << 0x38;
      sVar2 = fread(&local_40,1,8,local_38);
      uVar9 = (int)sVar2 + (int)sVar1 + (int)uVar10;
      uVar10 = (ulong)uVar9;
      pbVar3 = fp->idx;
      *(ulong *)((long)&pbVar3->offs[1].uaddr + lVar7) =
           local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
           (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
           (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
           (local_40 & 0xff00) << 0x28 | local_40 << 0x38;
      lVar6 = lVar6 + 1;
      iVar8 = pbVar3->noffs;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar8);
  }
  uVar10 = (ulong)(int)uVar9;
  iVar8 = iVar8 + -1;
LAB_0013dd3b:
  if ((long)iVar8 * 0x10 == uVar10) {
    fclose(__stream);
    return 0;
  }
  return -1;
}

Assistant:

int bgzf_index_load(BGZF *fp, const char *bname, const char *suffix)
{
    char *tmp = NULL;
    if ( suffix )
    {
        int blen = strlen(bname);
        int slen = strlen(suffix);
        tmp = (char*) malloc(blen + slen + 1);
        if ( !tmp ) return -1;
        memcpy(tmp,bname,blen);
        memcpy(tmp+blen,suffix,slen+1);
    }

    FILE *idx = fopen(tmp?tmp:bname,"rb");
    if ( tmp ) free(tmp);
    if ( !idx ) return -1;

    fp->idx = (bgzidx_t*) calloc(1,sizeof(bgzidx_t));
    uint64_t x;
    if ( fread(&x, 1, sizeof(x), idx) != sizeof(x) ) return -1;

    fp->idx->noffs = fp->idx->moffs = 1 + (fp->is_be ? ed_swap_8(x) : x);
    fp->idx->offs  = (bgzidx1_t*) malloc(fp->idx->moffs*sizeof(bgzidx1_t));
    fp->idx->offs[0].caddr = fp->idx->offs[0].uaddr = 0;

    int i;
    if ( fp->is_be )
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = ed_swap_8(x);
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = ed_swap_8(x);
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    else
    {
        int ret = 0;
        for (i=1; i<fp->idx->noffs; i++)
        {
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].caddr = x;
            ret += fread(&x, 1, sizeof(x), idx); fp->idx->offs[i].uaddr = x;
        }
        if ( ret != sizeof(x)*2*(fp->idx->noffs-1) ) return -1;
    }
    fclose(idx);
    return 0;

}